

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

void insertleaf(cbtDbvt *pdbvt,cbtDbvtNode *root,cbtDbvtNode *leaf)

{
  cbtDbvtNode **ppcVar1;
  bool bVar2;
  int iVar3;
  cbtDbvtNode *a;
  void *in_R8;
  cbtDbvtNode *parent;
  
  if (pdbvt->m_root == (cbtDbvtNode *)0x0) {
    pdbvt->m_root = leaf;
    leaf->parent = (cbtDbvtNode *)0x0;
  }
  else {
    for (; (root->field_2).childs[1] != (cbtDbvtNode *)0x0;
        root = *(cbtDbvtNode **)((long)(&root->volume + 1) + ((long)iVar3 + 1) * 8)) {
      iVar3 = Select(&leaf->volume,&(root->field_2).childs[0]->volume,
                     &(root->field_2).childs[1]->volume);
    }
    parent = root->parent;
    a = createnode(pdbvt,parent,&leaf->volume,&root->volume,in_R8);
    if (parent == (cbtDbvtNode *)0x0) {
      (a->field_2).childs[0] = root;
      root->parent = a;
      (a->field_2).childs[1] = leaf;
      leaf->parent = a;
      pdbvt->m_root = a;
    }
    else {
      *(cbtDbvtNode **)
       ((long)(&parent->volume + 1) + ((ulong)((root->parent->field_2).childs[1] == root) + 1) * 8)
           = a;
      (a->field_2).childs[0] = root;
      root->parent = a;
      (a->field_2).childs[1] = leaf;
      leaf->parent = a;
      do {
        bVar2 = cbtDbvtAabbMm::Contain(&parent->volume,&a->volume);
        if (bVar2) {
          return;
        }
        Merge(&(parent->field_2).childs[0]->volume,&(parent->field_2).childs[1]->volume,
              &parent->volume);
        ppcVar1 = &parent->parent;
        a = parent;
        parent = *ppcVar1;
      } while (*ppcVar1 != (cbtDbvtNode *)0x0);
    }
  }
  return;
}

Assistant:

static void insertleaf(cbtDbvt* pdbvt,
					   cbtDbvtNode* root,
					   cbtDbvtNode* leaf)
{
	if (!pdbvt->m_root)
	{
		pdbvt->m_root = leaf;
		leaf->parent = 0;
	}
	else
	{
		if (!root->isleaf())
		{
			do
			{
				root = root->childs[Select(leaf->volume,
										   root->childs[0]->volume,
										   root->childs[1]->volume)];
			} while (!root->isleaf());
		}
		cbtDbvtNode* prev = root->parent;
		cbtDbvtNode* node = createnode(pdbvt, prev, leaf->volume, root->volume, 0);
		if (prev)
		{
			prev->childs[indexof(root)] = node;
			node->childs[0] = root;
			root->parent = node;
			node->childs[1] = leaf;
			leaf->parent = node;
			do
			{
				if (!prev->volume.Contain(node->volume))
					Merge(prev->childs[0]->volume, prev->childs[1]->volume, prev->volume);
				else
					break;
				node = prev;
			} while (0 != (prev = node->parent));
		}
		else
		{
			node->childs[0] = root;
			root->parent = node;
			node->childs[1] = leaf;
			leaf->parent = node;
			pdbvt->m_root = node;
		}
	}
}